

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trodesnetworkpython.cpp
# Opt level: O2

PyObject *
vecToList<HighFreqDataType>::convert
          (vector<HighFreqDataType,_std::allocator<HighFreqDataType>_> *vec)

{
  pointer pHVar1;
  list *this;
  size_t i;
  ulong uVar2;
  long lVar3;
  
  this = (list *)operator_new(8);
  boost::python::detail::list_base::list_base((list_base *)this);
  lVar3 = 0;
  for (uVar2 = 0;
      pHVar1 = (vec->super__Vector_base<HighFreqDataType,_std::allocator<HighFreqDataType>_>).
               _M_impl.super__Vector_impl_data._M_start,
      uVar2 < (ulong)(((long)(vec->
                             super__Vector_base<HighFreqDataType,_std::allocator<HighFreqDataType>_>
                             )._M_impl.super__Vector_impl_data._M_finish - (long)pHVar1) / 0x90);
      uVar2 = uVar2 + 1) {
    boost::python::list::append<HighFreqDataType>
              (this,(HighFreqDataType *)
                    ((long)&(pHVar1->super_NetworkDataType)._vptr_NetworkDataType + lVar3));
    lVar3 = lVar3 + 0x90;
  }
  return (this->super_list_base).super_object.super_object_base.m_ptr;
}

Assistant:

static PyObject* convert(const std::vector<T>& vec){
        list* l = new list();
        for(size_t i = 0; i < vec.size(); i++){
            l->append(vec[i]);
        }
        return l->ptr();
    }